

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-lex.c
# Opt level: O2

void ztlex_destroy(ztlex_t *lex)

{
  int iVar1;
  
  if (lex != (ztlex_t *)0x0) {
    if ((FILE *)lex->file == (FILE *)0x0) {
      if ((int)lex->length != (int)lex->index) {
        fprintf(_stderr,"warning: lexer closed with %d bytes pending\n");
      }
    }
    else {
      iVar1 = feof((FILE *)lex->file);
      if (iVar1 == 0) {
        fwrite("warning: lexer closed with bytes pending\n",0x29,1,_stderr);
      }
      fclose((FILE *)lex->file);
    }
    (*lex->freefn)(lex);
    return;
  }
  return;
}

Assistant:

void ztlex_destroy(ztlex_t *lex)
{
  if (lex == NULL)
    return;

  if (lex->file)
  {
    if (!feof(lex->file))
      fprintf(stderr, "warning: lexer closed with bytes pending\n");

    fclose(lex->file);
  }
  else
  {
    int remaining = (int)(lex->length - lex->index);
    if (remaining)
      fprintf(stderr, "warning: lexer closed with %d bytes pending\n",
              remaining);
  }

  lex->freefn(lex);
}